

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O1

int Gia_ManIteratePaths(Gia_Man_t *p,int DelayC,int nPathMin,int nPathMax,int nPathLimit,
                       int fIgnoreBoxDelays,int fVerbose)

{
  undefined1 *puVar1;
  uint uVar2;
  uint uVar3;
  Vec_Int_t *vPath;
  int *piVar4;
  Vec_Int_t *pVVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  int nBoxes;
  uint local_34;
  
  vPath = (Vec_Int_t *)malloc(0x10);
  vPath->nCap = 100;
  vPath->nSize = 0;
  piVar4 = (int *)malloc(400);
  vPath->pArray = piVar4;
  if (p->vLevels != (Vec_Int_t *)0x0) {
    __assert_fail("p->vLevels == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecFadds.c"
                  ,0x4b1,"int Gia_ManIteratePaths(Gia_Man_t *, int, int, int, int, int, int)");
  }
  iVar9 = p->nObjs;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar9 - 1U) {
    iVar7 = iVar9;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar7;
  if (iVar7 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar7 << 2);
  }
  pVVar5->pArray = piVar4;
  pVVar5->nSize = iVar9;
  if (piVar4 != (int *)0x0) {
    memset(piVar4,0,(long)iVar9 << 2);
  }
  p->vLevels = pVVar5;
  Gia_ManCleanMark01(p);
  Gia_ManCleanPhase(p);
  pVVar5 = p->vCis;
  if (0 < pVVar5->nSize) {
    lVar6 = 0;
    do {
      iVar9 = pVVar5->pArray[lVar6];
      if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      puVar1 = &p->pObjs[iVar9].field_0x7;
      *puVar1 = *puVar1 | 0x80;
      lVar6 = lVar6 + 1;
      pVVar5 = p->vCis;
    } while (lVar6 < pVVar5->nSize);
  }
  if (fVerbose != 0) {
    printf("Running path detection: BoxDelay = %d, PathMin = %d, PathMax = %d, PathLimit = %d.\n",
           (ulong)(uint)DelayC,(ulong)(uint)nPathMin,(ulong)(uint)nPathMax,nPathLimit);
  }
  if (0 < nPathLimit) {
    uVar10 = 0;
    uVar8 = 0;
    do {
      iVar9 = DelayC;
      uVar2 = Gia_ManFindAnnotatedDelay(p,DelayC,(int *)&local_34,fIgnoreBoxDelays);
      uVar3 = Gia_ManFindPath(p,iVar9,nPathMin,nPathMax,vPath);
      if (uVar3 == 0xffffffff) break;
      uVar10 = uVar10 + (0 < (int)uVar3);
      if (fVerbose != 0) {
        printf("Iter %5d : Paths = %2d. Boxes = %2d. Total boxes = %6d.  Max delay = %5d.\n",uVar8,
               (ulong)uVar10,(ulong)uVar3,(ulong)local_34,(ulong)uVar2);
      }
      uVar2 = (int)uVar8 + 1;
      uVar8 = (ulong)uVar2;
    } while (nPathLimit != uVar2);
  }
  if (vPath->pArray != (int *)0x0) {
    free(vPath->pArray);
    vPath->pArray = (int *)0x0;
  }
  free(vPath);
  if (p->vLevels != (Vec_Int_t *)0x0) {
    piVar4 = p->vLevels->pArray;
    if (piVar4 != (int *)0x0) {
      free(piVar4);
      p->vLevels->pArray = (int *)0x0;
    }
    if (p->vLevels != (Vec_Int_t *)0x0) {
      free(p->vLevels);
      p->vLevels = (Vec_Int_t *)0x0;
    }
  }
  Gia_ManCleanPhase(p);
  return 1;
}

Assistant:

int Gia_ManIteratePaths( Gia_Man_t * p, int DelayC, int nPathMin, int nPathMax, int nPathLimit, int fIgnoreBoxDelays, int fVerbose )
{
    Gia_Obj_t * pObj;
    Vec_Int_t * vPath = Vec_IntAlloc( 100 );
    int i, RetValue, nBoxes, MaxDelay, nPaths = 0;
    assert( p->vLevels == NULL );
    p->vLevels = Vec_IntStart( Gia_ManObjNum(p) );
    Gia_ManCleanMark01( p );
    Gia_ManCleanPhase( p );
    Gia_ManForEachCi( p, pObj, i )
        pObj->fPhase = 1;
    if ( fVerbose )
        printf( "Running path detection: BoxDelay = %d, PathMin = %d, PathMax = %d, PathLimit = %d.\n", DelayC, nPathMin, nPathMax, nPathLimit );
    for ( i = 0; i < nPathLimit; i++ )
    {
        MaxDelay = Gia_ManFindAnnotatedDelay( p, DelayC, &nBoxes, fIgnoreBoxDelays );
        RetValue = Gia_ManFindPath( p, DelayC, nPathMin, nPathMax, vPath );
        if ( RetValue == -1 )
            break;
        nPaths += (RetValue > 0);
        if ( fVerbose )
            printf( "Iter %5d : Paths = %2d. Boxes = %2d. Total boxes = %6d.  Max delay = %5d.\n", i, nPaths, RetValue, nBoxes, MaxDelay );
    }
    Vec_IntFree( vPath );
    Vec_IntFreeP( &p->vLevels );
    Gia_ManCleanPhase( p );
    return 1;
}